

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

CodecFactory ** __thiscall
testing::internal::ValuesInIteratorRangeGenerator<const_libaom_test::CodecFactory_*>::Iterator::
Current(Iterator *this)

{
  CodecFactory **ppCVar1;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*const_*,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
      .super__Head_base<0UL,_const_libaom_test::CodecFactory_*const_*,_false>._M_head_impl ==
      (CodecFactory **)0x0) {
    ppCVar1 = (CodecFactory **)operator_new(8);
    *ppCVar1 = *(this->iterator_)._M_current;
    (this->value_)._M_t.
    super___uniq_ptr_impl<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*const_*,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
    .super__Head_base<0UL,_const_libaom_test::CodecFactory_*const_*,_false>._M_head_impl = ppCVar1;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_libaom_test::CodecFactory_*const,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*const_*,_std::default_delete<const_libaom_test::CodecFactory_*const>_>
         .super__Head_base<0UL,_const_libaom_test::CodecFactory_*const_*,_false>._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }